

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msatRead.c
# Opt level: O0

int Msat_ReadInt(char **pIn)

{
  bool bVar1;
  bool bVar2;
  int local_20;
  int local_14;
  int neg;
  int val;
  char **pIn_local;
  
  local_14 = 0;
  bVar2 = false;
  Msat_ReadWhitespace(pIn);
  if (**pIn == '-') {
    bVar2 = true;
    *pIn = *pIn + 1;
  }
  else if (**pIn == '+') {
    *pIn = *pIn + 1;
  }
  if (('/' < **pIn) && (**pIn < ':')) {
    while( true ) {
      bVar1 = false;
      if ('/' < **pIn) {
        bVar1 = **pIn < ':';
      }
      if (!bVar1) break;
      local_14 = local_14 * 10 + **pIn + -0x30;
      *pIn = *pIn + 1;
    }
    if (bVar2) {
      local_20 = -local_14;
    }
    else {
      local_20 = local_14;
    }
    return local_20;
  }
  fprintf(_stderr,"PARSE ERROR! Unexpected char: %c\n",(ulong)(uint)(int)**pIn);
  exit(1);
}

Assistant:

static int Msat_ReadInt( char ** pIn ) 
{
    int     val = 0;
    int     neg = 0;

    Msat_ReadWhitespace( pIn );
    if ( **pIn == '-' ) 
        neg = 1, 
        (*pIn)++;
    else if ( **pIn == '+' ) 
        (*pIn)++;
    if ( **pIn < '0' || **pIn > '9' ) 
        fprintf(stderr, "PARSE ERROR! Unexpected char: %c\n", **pIn), 
        exit(1);
    while ( **pIn >= '0' && **pIn <= '9' )
        val = val*10 + (**pIn - '0'),
        (*pIn)++;
    return neg ? -val : val; 
}